

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompression.cpp
# Opt level: O2

void Imf_3_4::getCompressionNamesString(string *separator,string *str)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  for (lVar1 = 0; lVar1 != 0x288; lVar1 = lVar1 + 0x48) {
    std::operator+(&bStack_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (IdToDesc + lVar1),separator);
    std::__cxx11::string::append((string *)str);
    std::__cxx11::string::~string((string *)&bStack_48);
  }
  std::__cxx11::string::append((string *)str);
  return;
}

Assistant:

void
getCompressionNamesString (const std::string& separator, std::string& str)
{
    int i = 0;
    for (; i < static_cast<int> (NUM_COMPRESSION_METHODS) - 1; i++)
    {
        str += IdToDesc[i].name + separator;
    }
    str += IdToDesc[i].name;
}